

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O1

void fill_inverse_cmap(j_decompress_ptr cinfo,int c0,int c1,int c2)

{
  byte bVar1;
  J_COLOR_SPACE JVar2;
  int iVar3;
  int iVar4;
  JSAMPARRAY ppJVar5;
  JSAMPROW pJVar6;
  JSAMPROW pJVar7;
  JSAMPROW pJVar8;
  jpeg_color_quantizer *pjVar9;
  _func_void_j_decompress_ptr *p_Var10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  long *plVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  byte *pbVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  byte *pbVar33;
  uint uVar34;
  uint uVar35;
  long *plVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  long lVar40;
  uint uVar41;
  long lVar42;
  bool bVar43;
  JSAMPLE colorlist [256];
  JLONG bestdist [128];
  byte local_9b8 [128];
  byte abStack_938 [256];
  long local_838 [257];
  
  uVar26 = c0 * 8 & 0xffffffe0;
  uVar11 = uVar26 + 4;
  uVar27 = c1 * 4 & 0xffffffe0;
  uVar12 = uVar27 + 2;
  uVar13 = c2 * 8 & 0xffffffe0;
  uVar17 = uVar13 + 4;
  iVar22 = cinfo->actual_number_of_colors;
  lVar31 = (long)iVar22;
  if (lVar31 < 1) {
    lVar14 = 0x7fffffff;
  }
  else {
    uVar34 = c0 * 8 | 0x1c;
    uVar38 = c1 * 4 | 0x1e;
    uVar21 = c2 * 8 | 0x1c;
    ppJVar5 = cinfo->colormap;
    pJVar6 = *ppJVar5;
    pJVar7 = ppJVar5[1];
    pJVar8 = ppJVar5[2];
    JVar2 = cinfo->out_color_space;
    iVar3 = c_scales[rgb_red[JVar2]];
    iVar4 = c_scales[rgb_green[JVar2]];
    iVar24 = c_scales[rgb_blue[JVar2]];
    lVar14 = 0x7fffffff;
    lVar40 = 0;
    do {
      bVar1 = pJVar6[lVar40];
      uVar29 = (uint)bVar1;
      uVar41 = uVar34;
      if ((int)uVar29 < (int)uVar11) {
        lVar28 = (long)(int)((uVar29 - uVar11) * iVar3);
        lVar28 = lVar28 * lVar28;
      }
      else {
        iVar18 = bVar1 - uVar34;
        if (iVar18 == 0 || (int)(uint)bVar1 < (int)uVar34) {
          if (uVar26 + uVar34 + 4 >> 1 < uVar29) {
            uVar41 = uVar11;
          }
          lVar28 = 0;
        }
        else {
          lVar28 = (long)(iVar18 * iVar3);
          lVar28 = lVar28 * lVar28;
          uVar41 = uVar11;
        }
      }
      bVar1 = pJVar7[lVar40];
      uVar37 = (uint)bVar1;
      uVar39 = uVar38;
      if ((int)uVar37 < (int)uVar12) {
        lVar20 = (long)(int)((uVar37 - uVar12) * iVar4);
        lVar28 = lVar28 + lVar20 * lVar20;
      }
      else {
        iVar18 = bVar1 - uVar38;
        if (iVar18 == 0 || (int)(uint)bVar1 < (int)uVar38) {
          if (uVar27 + uVar38 + 2 >> 1 < uVar37) {
            uVar39 = uVar12;
          }
        }
        else {
          lVar20 = (long)(iVar18 * iVar4);
          lVar28 = lVar28 + lVar20 * lVar20;
          uVar39 = uVar12;
        }
      }
      bVar1 = pJVar8[lVar40];
      uVar35 = (uint)bVar1;
      uVar19 = uVar21;
      if ((int)uVar35 < (int)uVar17) {
        lVar20 = (long)(int)((uVar35 - uVar17) * iVar24);
        lVar28 = lVar28 + lVar20 * lVar20;
      }
      else {
        iVar18 = bVar1 - uVar21;
        if (iVar18 == 0 || (int)(uint)bVar1 < (int)uVar21) {
          if (uVar13 + uVar21 + 4 >> 1 < uVar35) {
            uVar19 = uVar17;
          }
        }
        else {
          lVar20 = (long)(iVar18 * iVar24);
          lVar28 = lVar28 + lVar20 * lVar20;
          uVar19 = uVar17;
        }
      }
      lVar20 = (long)(int)((uVar29 - uVar41) * iVar3);
      lVar42 = (long)(int)((uVar37 - uVar39) * iVar4);
      lVar30 = (long)(int)((uVar35 - uVar19) * iVar24);
      lVar20 = lVar30 * lVar30 + lVar42 * lVar42 + lVar20 * lVar20;
      if (lVar14 <= lVar20) {
        lVar20 = lVar14;
      }
      lVar14 = lVar20;
      local_838[lVar40] = lVar28;
      lVar40 = lVar40 + 1;
    } while (lVar31 != lVar40);
  }
  pjVar9 = cinfo->cquantize;
  if (iVar22 < 1) {
    uVar13 = 0;
  }
  else {
    lVar40 = 0;
    uVar13 = 0;
    do {
      if (local_838[lVar40] <= lVar14) {
        lVar28 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        abStack_938[lVar28] = (byte)lVar40;
      }
      lVar40 = lVar40 + 1;
    } while (lVar31 != lVar40);
  }
  p_Var10 = pjVar9[1].finish_pass;
  lVar31 = 0;
  do {
    local_838[lVar31] = 0x7fffffff;
    local_838[lVar31 + 1] = 0x7fffffff;
    lVar31 = lVar31 + 2;
  } while (lVar31 != 0x80);
  if (0 < (int)uVar13) {
    uVar16 = 0;
    do {
      bVar1 = abStack_938[uVar16];
      ppJVar5 = cinfo->colormap;
      JVar2 = cinfo->out_color_space;
      iVar22 = c_scales[rgb_red[JVar2]];
      lVar31 = (long)(int)((uVar11 - (*ppJVar5)[bVar1]) * iVar22);
      iVar3 = c_scales[rgb_green[JVar2]];
      lVar14 = (long)(int)((uVar12 - ppJVar5[1][bVar1]) * iVar3);
      iVar4 = c_scales[rgb_blue[JVar2]];
      lVar40 = (long)(int)((uVar17 - ppJVar5[2][bVar1]) * iVar4);
      lVar28 = lVar40 * lVar40 + lVar14 * lVar14 + lVar31 * lVar31;
      lVar31 = (ulong)(uint)(iVar22 * 8 * iVar22 * 8) + iVar22 * lVar31 * 0x10;
      iVar22 = 3;
      pbVar25 = local_9b8;
      plVar36 = local_838;
      do {
        iVar24 = 7;
        lVar20 = (ulong)(uint)(iVar3 * 4 * iVar3 * 4) + iVar3 * lVar14 * 8;
        lVar30 = lVar28;
        do {
          plVar15 = plVar36;
          lVar32 = 0;
          lVar42 = (ulong)(uint)(iVar4 * 8 * iVar4 * 8) + iVar4 * lVar40 * 0x10;
          lVar23 = lVar30;
          do {
            if (lVar23 < *(long *)((long)plVar15 + lVar32)) {
              *(long *)((long)plVar15 + lVar32) = lVar23;
              *pbVar25 = bVar1;
            }
            lVar23 = lVar23 + lVar42;
            JVar2 = cinfo->out_color_space;
            lVar42 = lVar42 + c_scales[rgb_blue[JVar2]] * c_scales[rgb_blue[JVar2]] * 0x80;
            pbVar25 = pbVar25 + 1;
            lVar32 = lVar32 + 8;
          } while ((int)lVar32 != 0x20);
          lVar30 = lVar30 + lVar20;
          lVar20 = lVar20 + c_scales[rgb_green[JVar2]] * c_scales[rgb_green[JVar2]] * 0x20;
          bVar43 = iVar24 != 0;
          iVar24 = iVar24 + -1;
          plVar36 = (long *)((long)plVar15 + lVar32);
        } while (bVar43);
        lVar28 = lVar28 + lVar31;
        lVar31 = lVar31 + c_scales[rgb_red[JVar2]] * c_scales[rgb_red[JVar2]] * 0x80;
        plVar36 = (long *)((long)plVar15 + lVar32);
        bVar43 = iVar22 != 0;
        iVar22 = iVar22 + -1;
      } while (bVar43);
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar13);
  }
  pbVar25 = local_9b8;
  uVar16 = 0;
  do {
    lVar31 = *(long *)(p_Var10 + (uVar16 | (long)(int)(c0 & 0xfffffffc)) * 8) +
             (long)(int)(c1 & 0xfffffff8) * 0x40 + (ulong)((uint)c2 >> 2) * 8;
    lVar14 = 0;
    do {
      pbVar33 = pbVar25;
      lVar40 = 0;
      do {
        *(ushort *)(lVar31 + lVar40 * 2) = pbVar33[lVar40] + 1;
        lVar40 = lVar40 + 1;
      } while (lVar40 != 4);
      lVar14 = lVar14 + 1;
      lVar31 = lVar31 + 0x40;
      pbVar25 = pbVar33 + 4;
    } while (lVar14 != 8);
    uVar16 = uVar16 + 1;
    pbVar25 = pbVar33 + 4;
  } while (uVar16 != 4);
  return;
}

Assistant:

LOCAL(void)
fill_inverse_cmap(j_decompress_ptr cinfo, int c0, int c1, int c2)
/* Fill the inverse-colormap entries in the update box that contains */
/* histogram cell c0/c1/c2.  (Only that one cell MUST be filled, but */
/* we can fill as many others as we wish.) */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  int minc0, minc1, minc2;      /* lower left corner of update box */
  int ic0, ic1, ic2;
  register JSAMPLE *cptr;       /* pointer into bestcolor[] array */
  register histptr cachep;      /* pointer into main cache array */
  /* This array lists the candidate colormap indexes. */
  JSAMPLE colorlist[MAXNUMCOLORS];
  int numcolors;                /* number of candidate colors */
  /* This array holds the actually closest colormap index for each cell. */
  JSAMPLE bestcolor[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

  /* Convert cell coordinates to update box ID */
  c0 >>= BOX_C0_LOG;
  c1 >>= BOX_C1_LOG;
  c2 >>= BOX_C2_LOG;

  /* Compute true coordinates of update box's origin corner.
   * Actually we compute the coordinates of the center of the corner
   * histogram cell, which are the lower bounds of the volume we care about.
   */
  minc0 = (c0 << BOX_C0_SHIFT) + ((1 << C0_SHIFT) >> 1);
  minc1 = (c1 << BOX_C1_SHIFT) + ((1 << C1_SHIFT) >> 1);
  minc2 = (c2 << BOX_C2_SHIFT) + ((1 << C2_SHIFT) >> 1);

  /* Determine which colormap entries are close enough to be candidates
   * for the nearest entry to some cell in the update box.
   */
  numcolors = find_nearby_colors(cinfo, minc0, minc1, minc2, colorlist);

  /* Determine the actually nearest colors. */
  find_best_colors(cinfo, minc0, minc1, minc2, numcolors, colorlist,
                   bestcolor);

  /* Save the best color numbers (plus 1) in the main cache array */
  c0 <<= BOX_C0_LOG;            /* convert ID back to base cell indexes */
  c1 <<= BOX_C1_LOG;
  c2 <<= BOX_C2_LOG;
  cptr = bestcolor;
  for (ic0 = 0; ic0 < BOX_C0_ELEMS; ic0++) {
    for (ic1 = 0; ic1 < BOX_C1_ELEMS; ic1++) {
      cachep = &histogram[c0 + ic0][c1 + ic1][c2];
      for (ic2 = 0; ic2 < BOX_C2_ELEMS; ic2++) {
        *cachep++ = (histcell)((*cptr++) + 1);
      }
    }
  }
}